

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O0

void __thiscall xray_re::xr_glow_object::xr_glow_object(xr_glow_object *this,xr_scene *scene)

{
  allocator<char> local_19;
  xr_scene *local_18;
  xr_scene *scene_local;
  xr_glow_object *this_local;
  
  local_18 = scene;
  scene_local = (xr_scene *)this;
  xr_custom_object::xr_custom_object(&this->super_xr_custom_object,scene,TOOLS_CLASS_GLOW);
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_glow_object_0038d990;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_shader,"effects\\glow",&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::__cxx11::string::string((string *)&this->m_texture);
  this->m_radius = 0.5;
  this->m_flags = 0;
  return;
}

Assistant:

xr_glow_object::xr_glow_object(xr_scene& scene):
	xr_custom_object(scene, TOOLS_CLASS_GLOW),
	m_shader("effects\\glow"), m_radius(0.5f), m_flags(0) {}